

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

iterator __thiscall
slang::SmallVectorBase<(anonymous_namespace)::Constructable>::emplace<int>
          (SmallVectorBase<(anonymous_namespace)::Constructable> *this,const_iterator pos,int *args)

{
  int iVar1;
  size_type sVar2;
  undefined8 in_RAX;
  pointer pCVar3;
  iterator extraout_RAX;
  iterator pCVar4;
  Constructable *pCVar5;
  Constructable temp;
  Constructable local_18;
  
  sVar2 = this->len;
  if (sVar2 == this->cap) {
    pCVar3 = emplaceRealloc<int>(this,pos,args);
    return pCVar3;
  }
  pCVar5 = this->data_ + sVar2;
  if (pCVar5 == pos) {
    iVar1 = *args;
    pCVar5->constructed = true;
    pCVar5->value = iVar1;
    (anonymous_namespace)::Constructable::numConstructorCalls =
         (anonymous_namespace)::Constructable::numConstructorCalls + 1;
    pCVar4 = (iterator)(sVar2 + 1);
    this->len = (size_type)pCVar4;
  }
  else {
    local_18._1_7_ = SUB87((ulong)in_RAX >> 8,0);
    local_18.constructed = true;
    local_18.value = *args;
    (anonymous_namespace)::Constructable::numConstructorCalls =
         (anonymous_namespace)::Constructable::numConstructorCalls + 1;
    anon_unknown.dwarf_965823::Constructable::Constructable(pCVar5,pCVar5 + -1);
    pCVar5 = (Constructable *)this->len;
    std::ranges::__move_backward_fn::
    operator()<(anonymous_namespace)::Constructable_*,_(anonymous_namespace)::Constructable_*,_(anonymous_namespace)::Constructable_*>
              ((__move_backward_fn *)pos,this->data_ + (long)((long)&pCVar5[-1].value + 3),
               this->data_ + (long)pCVar5,pCVar5);
    anon_unknown.dwarf_965823::Constructable::operator=(pos,&local_18);
    this->len = this->len + 1;
    anon_unknown.dwarf_965823::Constructable::~Constructable(&local_18);
    pCVar4 = extraout_RAX;
  }
  return pCVar4;
}

Assistant:

iterator emplace(const_iterator pos, Args&&... args) {
        auto result = const_cast<iterator>(pos);
        if (len == cap)
            return emplaceRealloc(result, std::forward<Args>(args)...);

        if (pos == end()) {
            // Emplace at end can be constructed in place.
            new (end()) T(std::forward<Args>(args)...);
            len++;
            return result;
        }

        // Construct a temporary to avoid aliasing an existing element we're about to move.
        T temp(std::forward<Args>(args)...);

        // Manually move the last element backward by one because it's uninitialized space.
        new (end()) T(std::move(back()));

        // Now move everything else and insert our temporary.
        std::ranges::move_backward(result, end() - 1, end());
        *result = std::move(temp);

        len++;
        return result;
    }